

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

int checkForBiomesAtLayer
              (LayerStack *g,Layer *entry,int *cache,uint64_t seed,int x,int z,uint w,uint h,
              BiomeFilter *filter)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  int *cache_00;
  uint64_t uVar8;
  uint64_t uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int x_00;
  uint local_128;
  filter_data_t fd [9];
  
  if ((filter->flags & 1) != 0) {
    iVar6 = entry->scale;
    iVar18 = iVar6 * x;
    iVar4 = iVar6 * z;
    iVar14 = filter->specialCnt;
    if (0 < iVar14) {
      iVar5 = g->layers[0xe].scale;
      uVar8 = getStartSeed(seed,g->layers[0xe].layerSalt);
      for (iVar17 = iVar4 / iVar5 + (z >> 0x1f); x_00 = iVar18 / iVar5 + (x >> 0x1f),
          iVar17 <= (int)(iVar6 * h + iVar4) / iVar5 - ((int)~(h + z) >> 0x1f); iVar17 = iVar17 + 1)
      {
        for (; x_00 <= (int)(iVar6 * w + iVar18) / iVar5 - ((int)~(w + x) >> 0x1f); x_00 = x_00 + 1)
        {
          uVar9 = getChunkSeed(uVar8,x_00,iVar17);
          auVar2._8_8_ = (long)uVar9 >> 0x3f;
          auVar2._0_8_ = (long)uVar9 >> 0x18;
          iVar14 = iVar14 - (uint)(SUB168(auVar2 % SEXT816(0xd),0) == 0);
        }
      }
      if (0 < iVar14) {
        return 0;
      }
    }
    local_128 = h + z;
    iVar14 = g->layers[0x15].scale;
    iVar5 = iVar18 / iVar14 + (x >> 0x1f);
    iVar17 = iVar4 / iVar14 + (z >> 0x1f);
    iVar18 = (int)(iVar6 * w + iVar18) / iVar14 - ((int)~(w + x) >> 0x1f);
    iVar6 = (int)(iVar6 * h + iVar4) / iVar14 - ((int)~local_128 >> 0x1f);
    uVar10 = filter->majorToFind;
    if (((uint)uVar10 >> 0xe & 1) != 0) {
      uVar8 = getStartSeed(seed,g->layers[0x13].layerSalt);
      iVar14 = iVar17;
      do {
        iVar4 = iVar5;
        if (iVar6 < iVar14) {
          return 0;
        }
        while (iVar4 <= iVar18) {
          uVar9 = getChunkSeed(uVar8,iVar4,iVar14);
          auVar3._8_8_ = (long)uVar9 >> 0x3f;
          auVar3._0_8_ = (long)uVar9 >> 0x18;
          iVar4 = iVar4 + 1;
          if (SUB168(auVar3 % SEXT816(100),0) == 0) goto LAB_0010d625;
        }
        iVar14 = iVar14 + 1;
      } while( true );
    }
LAB_0010d625:
    uVar8 = getStartSeed(seed,g->layers[0x15].layerSalt);
    uVar11 = 0;
    for (; iVar14 = iVar5, iVar17 <= iVar6; iVar17 = iVar17 + 1) {
      for (; iVar14 <= iVar18; iVar14 = iVar14 + 1) {
        uVar9 = getChunkSeed(uVar8,iVar14,iVar17);
        lVar12 = ((long)uVar9 >> 0x18) % 6;
        lVar13 = ((long)uVar9 >> 0x18) % 3;
        uVar11 = ((ulong)(((uint)(lVar13 >> 0x3f) & 3) + (int)lVar13 != 0) << 0x26) + 0x4000000000 |
                 uVar11;
        switch(((uint)(lVar12 >> 0x3f) & 6) + (int)lVar12) {
        case 0:
          uVar11 = uVar11 | 0x14;
          break;
        case 1:
          uVar11 = uVar11 | 0x20000004;
          break;
        case 2:
          uVar11 = uVar11 | 0xc;
          break;
        case 3:
          uVar11 = uVar11 | 0x800000002;
          break;
        case 4:
          uVar11 = uVar11 | 0x808000000;
          break;
        case 5:
          uVar11 = uVar11 | 0x42;
        }
      }
    }
    if ((uVar10 & ~uVar11 & 0xc82800005e) != 0) {
      return 0;
    }
  }
  iVar6 = 0;
  cache_00 = cache;
  if (cache == (int *)0x0) {
    sVar7 = getMinLayerCacheSize(entry,w,h);
    iVar6 = (int)sVar7;
    cache_00 = (int *)calloc((long)iVar6,4);
  }
  if ((h * w < 2) || (filter->biomeToExclM == 0 && filter->biomeToExcl == 0)) {
LAB_0010d828:
    fd[0].map = (_func_int_Layer_ptr_int_ptr_int_int_int_int *)g->layers[0x37].getMap;
    g->layers[0x37].data = fd;
    g->layers[0x37].getMap = mapFilterOceanMix;
    fd[1].map = (_func_int_Layer_ptr_int_ptr_int_int_int_int *)g->layers[0x2f].getMap;
    g->layers[0x2f].data = fd + 1;
    g->layers[0x2f].getMap = mapFilterRiverMix;
    fd[2].map = (_func_int_Layer_ptr_int_ptr_int_int_int_int *)g->layers[0x22].getMap;
    g->layers[0x22].data = fd + 2;
    g->layers[0x22].getMap = mapFilterShore;
    fd[3].map = (_func_int_Layer_ptr_int_ptr_int_int_int_int *)g->layers[0x1e].getMap;
    g->layers[0x1e].data = fd + 3;
    g->layers[0x1e].getMap = mapFilterRareBiome;
    fd[4].map = (_func_int_Layer_ptr_int_ptr_int_int_int_int *)g->layers[0x19].getMap;
    g->layers[0x19].data = fd + 4;
    g->layers[0x19].getMap = mapFilterBiomeEdge;
    fd[5].map = (_func_int_Layer_ptr_int_ptr_int_int_int_int *)g->layers[0x30].getMap;
    g->layers[0x30].data = fd + 5;
    g->layers[0x30].getMap = mapFilterOceanTemp;
    fd[6].map = (_func_int_Layer_ptr_int_ptr_int_int_int_int *)g->layers[0x15].getMap;
    g->layers[0x15].data = fd + 6;
    g->layers[0x15].getMap = mapFilterBiome;
    fd[7].map = (_func_int_Layer_ptr_int_ptr_int_int_int_int *)g->layers[0x13].getMap;
    g->layers[0x13].data = fd + 7;
    g->layers[0x13].getMap = mapFilterMushroom;
    fd[8].map = (_func_int_Layer_ptr_int_ptr_int_int_int_int *)g->layers[0xe].getMap;
    g->layers[0xe].data = fd + 8;
    g->layers[0xe].getMap = mapFilterSpecial;
    fd[0].bf = filter;
    fd[1].bf = filter;
    fd[2].bf = filter;
    fd[3].bf = filter;
    fd[4].bf = filter;
    fd[5].bf = filter;
    fd[6].bf = filter;
    fd[7].bf = filter;
    fd[8].bf = filter;
    setLayerSeed(entry,seed);
    iVar6 = (*entry->getMap)(entry,cache_00,x,z,w,h);
    if (iVar6 == 2) {
      uVar15 = 2;
    }
    else {
      uVar15 = 0;
      if (iVar6 == 0) {
        uVar10 = 0;
        uVar11 = 0;
        for (uVar16 = 0; h * w != uVar16; uVar16 = uVar16 + 1) {
          iVar6 = cache_00[uVar16];
          if ((long)iVar6 < 0x80) {
            uVar10 = uVar10 | 1L << ((long)iVar6 & 0x3fU);
          }
          else {
            uVar11 = uVar11 | 1L << ((ulong)(byte)((char)iVar6 + 0x80) & 0x3f);
          }
        }
        uVar16 = filter->biomeToFind;
        uVar1 = filter->biomeToFindM;
        uVar15 = (uint)(((((filter->biomeToPickM & uVar11) != 0 ||
                          (filter->biomeToPick & uVar10) != 0) ||
                         filter->biomeToPickM == 0 && filter->biomeToPick == 0) &&
                        ((filter->biomeToExclM & uVar11) == 0 && (filter->biomeToExcl & uVar10) == 0
                        || filter->biomeToExclM == 0 && filter->biomeToExcl == 0)) &&
                       ((uVar11 & uVar1) == uVar1 && (uVar10 & uVar16) == uVar16 ||
                       uVar1 == 0 && uVar16 == 0));
      }
    }
    g->layers[0xe].getMap = (mapfunc_t *)fd[8].map;
    g->layers[0xe].data = (void *)0x0;
    g->layers[0x13].getMap = (mapfunc_t *)fd[7].map;
    g->layers[0x13].data = (void *)0x0;
    g->layers[0x15].getMap = (mapfunc_t *)fd[6].map;
    g->layers[0x15].data = (void *)0x0;
    g->layers[0x30].getMap = (mapfunc_t *)fd[5].map;
    g->layers[0x30].data = (void *)0x0;
    g->layers[0x19].getMap = (mapfunc_t *)fd[4].map;
    g->layers[0x19].data = (void *)0x0;
    g->layers[0x1e].getMap = (mapfunc_t *)fd[3].map;
    g->layers[0x1e].data = (void *)0x0;
    g->layers[0x22].getMap = (mapfunc_t *)fd[2].map;
    g->layers[0x22].data = (void *)0x0;
    g->layers[0x2f].getMap = (mapfunc_t *)fd[1].map;
    g->layers[0x2f].data = (void *)0x0;
    g->layers[0x37].data = (void *)0x0;
    g->layers[0x37].getMap = (mapfunc_t *)fd[0].map;
  }
  else {
    if (iVar6 == 0) {
      sVar7 = getMinLayerCacheSize(entry,w,h);
      iVar6 = (int)sVar7;
    }
    sVar7 = getMinLayerCacheSize(entry,1,1);
    iVar14 = (int)sVar7;
    if (iVar14 * 2 < iVar6) {
      setLayerSeed(entry,seed);
      iVar4 = testExclusion(entry,cache_00,(w >> 1) + x,(h >> 1) + z,filter);
      if (iVar14 * 5 < iVar6) {
        if (iVar4 == 0) goto LAB_0010d791;
      }
      else {
LAB_0010d81d:
        if (iVar4 == 0) goto LAB_0010d828;
      }
    }
    else {
      if (iVar6 <= iVar14 * 5) goto LAB_0010d828;
LAB_0010d791:
      iVar6 = testExclusion(entry,cache_00,x,z,filter);
      if (iVar6 == 0) {
        iVar14 = w + x + -1;
        iVar4 = (h - 1) + z;
        iVar6 = testExclusion(entry,cache_00,iVar14,iVar4,filter);
        if ((iVar6 == 0) && (iVar6 = testExclusion(entry,cache_00,x,iVar4,filter), iVar6 == 0)) {
          iVar4 = testExclusion(entry,cache_00,iVar14,z,filter);
          goto LAB_0010d81d;
        }
      }
    }
    uVar15 = 0;
  }
  if (cache == (int *)0x0) {
    free(cache_00);
  }
  return uVar15;
}

Assistant:

int checkForBiomesAtLayer(
        LayerStack        * g,
        Layer             * entry,
        int               * cache,
        uint64_t            seed,
        int                 x,
        int                 z,
        unsigned int        w,
        unsigned int        h,
        const BiomeFilter * filter
        )
{
    Layer *l;
    int *ids;
    int ret, err;
    int memsiz, mem1x1;

    if (filter->flags & BF_APPROX) // TODO: protoCheck for 1.6-
    {
        l = entry;

        int i, j;
        int bx = x * l->scale;
        int bz = z * l->scale;
        int bw = w * l->scale;
        int bh = h * l->scale;
        int x0, z0, x1, z1;
        uint64_t ss, cs;
        uint64_t potential, required;

        int specialcnt = filter->specialCnt;
        if (specialcnt > 0)
        {
            l = &g->layers[L_SPECIAL_1024];
            x0 = (bx) / l->scale; if (x < 0) x0--;
            z0 = (bz) / l->scale; if (z < 0) z0--;
            x1 = (bx + bw) / l->scale; if (x+(int)w >= 0) x1++;
            z1 = (bz + bh) / l->scale; if (z+(int)h >= 0) z1++;
            ss = getStartSeed(seed, l->layerSalt);

            for (j = z0; j <= z1; j++)
            {
                for (i = x0; i <= x1; i++)
                {
                    cs = getChunkSeed(ss, i, j);
                    if (mcFirstIsZero(cs, 13))
                        specialcnt--;
                }
            }
            if (specialcnt > 0)
                return 0;
        }

        l = &g->layers[L_BIOME_256];
        x0 = bx / l->scale; if (x < 0) x0--;
        z0 = bz / l->scale; if (z < 0) z0--;
        x1 = (bx + bw) / l->scale; if (x+(int)w >= 0) x1++;
        z1 = (bz + bh) / l->scale; if (z+(int)h >= 0) z1++;

        if (filter->majorToFind & (1ULL << mushroom_fields))
        {
            ss = getStartSeed(seed, g->layers[L_MUSHROOM_256].layerSalt);

            for (j = z0; j <= z1; j++)
            {
                for (i = x0; i <= x1; i++)
                {
                    cs = getChunkSeed(ss, i, j);
                    if (mcFirstIsZero(cs, 100))
                        goto L_has_proto_mushroom;
                }
            }
            return 0;
        }
L_has_proto_mushroom:

        potential = 0;
        required = filter->majorToFind & (
                (1ULL << badlands_plateau) | (1ULL << wooded_badlands_plateau) |
                (1ULL << desert) | (1ULL << savanna) | (1ULL << plains) |
                (1ULL << forest) | (1ULL << dark_forest) | (1ULL << mountains) |
                (1ULL << birch_forest) | (1ULL << swamp));

        ss = getStartSeed(seed, l->layerSalt);

        for (j = z0; j <= z1; j++)
        {
            for (i = x0; i <= x1; i++)
            {
                cs = getChunkSeed(ss, i, j);
                int cs6 = mcFirstInt(cs, 6);
                int cs3 = mcFirstInt(cs, 3);
                int cs4 = mcFirstInt(cs, 4);

                if (cs3) potential |= (1ULL << badlands_plateau);
                else potential |= (1ULL << wooded_badlands_plateau);

                switch (cs6)
                {
                case 0: potential |= (1ULL << desert) | (1ULL << forest); break;
                case 1: potential |= (1ULL << desert) | (1ULL << dark_forest); break;
                case 2: potential |= (1ULL << desert) | (1ULL << mountains); break;
                case 3: potential |= (1ULL << savanna) | (1ULL << plains); break;
                case 4: potential |= (1ULL << savanna) | (1ULL << birch_forest); break;
                case 5: potential |= (1ULL << plains) | (1ULL << swamp); break;
                }

                if (cs4 == 3) potential |= (1ULL << snowy_taiga);
                else potential |= (1ULL << snowy_tundra);
            }
        }

        if ((potential & required) ^ required)
            return 0;
    }

    l = g->layers;
    if (cache)
    {
        memsiz = 0;
        ids = cache;
    }
    else
    {
        memsiz = getMinLayerCacheSize(entry, w, h);
        ids = (int*) calloc(memsiz, sizeof(int));
    }

    if ((filter->biomeToExcl | filter->biomeToExclM) && w*h > 1)
    {
        err = 0;
        if (memsiz == 0)
            memsiz = getMinLayerCacheSize(entry, w, h);
        mem1x1 = getMinLayerCacheSize(entry, 1, 1);
        if (mem1x1 * 2 < memsiz)
        {
            setLayerSeed(entry, seed);
            err = testExclusion(entry, ids, x+w/2, z+h/2, filter);
        }
        if (mem1x1 * 5 < memsiz)
        {
            if (!err) err = testExclusion(entry, ids, x,     z,     filter);
            if (!err) err = testExclusion(entry, ids, x+w-1, z+h-1, filter);
            if (!err) err = testExclusion(entry, ids, x,     z+h-1, filter);
            if (!err) err = testExclusion(entry, ids, x+w-1, z,     filter);
        }
        if (err)
        {
            if (cache == NULL)
                free(ids);
            return 0;
        }
    }

    filter_data_t fd[9];
    swapMap(fd+0, filter, l+L_OCEAN_MIX_4,    mapFilterOceanMix);
    swapMap(fd+1, filter, l+L_RIVER_MIX_4,    mapFilterRiverMix);
    swapMap(fd+2, filter, l+L_SHORE_16,       mapFilterShore);
    swapMap(fd+3, filter, l+L_SUNFLOWER_64,   mapFilterRareBiome);
    swapMap(fd+4, filter, l+L_BIOME_EDGE_64,  mapFilterBiomeEdge);
    swapMap(fd+5, filter, l+L_OCEAN_TEMP_256, mapFilterOceanTemp);
    swapMap(fd+6, filter, l+L_BIOME_256,      mapFilterBiome);
    swapMap(fd+7, filter, l+L_MUSHROOM_256,   mapFilterMushroom);
    swapMap(fd+8, filter, l+L_SPECIAL_1024,   mapFilterSpecial);

    ret = 0;
    setLayerSeed(entry, seed);
    err = entry->getMap(entry, ids, x, z, w, h);
    if (err == 0)
    {
        uint64_t b = 0, m = 0;
        unsigned int i;
        for (i = 0; i < w*h; i++)
        {
            int id = ids[i];
            if (id < 128) b |= (1ULL << id);
            else m |= (1ULL << (id-128));
        }

        int match_exc = (filter->biomeToExcl|filter->biomeToExclM) == 0;
        int match_any = (filter->biomeToPick|filter->biomeToPickM) == 0;
        int match_req = (filter->biomeToFind|filter->biomeToFindM) == 0;
        match_exc |= ((b & filter->biomeToExcl) || (m & filter->biomeToExclM)) == 0;
        match_any |= ((b & filter->biomeToPick) || (m & filter->biomeToPickM));
        match_req |= ((b & filter->biomeToFind)  == filter->biomeToFind &&
                      (m & filter->biomeToFindM) == filter->biomeToFindM);
        if (match_exc && match_any && match_req)
            ret = 1;
    }
    else if (err == M_STOP)
    {   // biome requirements not met
        ret = 0;
    }
    else if (err == M_DONE)
    {   // exclusion biomes cannot generate
        ret = 2;
    }

    restoreMap(fd+8, l+L_SPECIAL_1024);
    restoreMap(fd+7, l+L_MUSHROOM_256);
    restoreMap(fd+6, l+L_BIOME_256);
    restoreMap(fd+5, l+L_OCEAN_TEMP_256);
    restoreMap(fd+4, l+L_BIOME_EDGE_64);
    restoreMap(fd+3, l+L_SUNFLOWER_64);
    restoreMap(fd+2, l+L_SHORE_16);
    restoreMap(fd+1, l+L_RIVER_MIX_4);
    restoreMap(fd+0, l+L_OCEAN_MIX_4);

    if (cache == NULL)
        free(ids);

    return ret;
}